

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

size_t __thiscall
kws::Parser::FindConstructor
          (Parser *this,string *buffer,string *className,bool headerfile,size_t startPos)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var1;
  ulong uVar2;
  reference pcVar3;
  byte in_CL;
  string *in_RDX;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  bool bVar4;
  string localconstructor;
  size_t pos5;
  size_t pos4;
  char i_1;
  iterator __end4;
  iterator __begin4;
  string *__range4;
  bool ok2;
  char i;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  bool ok;
  string val;
  size_t pos3;
  size_t pos2;
  size_t pos;
  string constructor;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe70;
  allocator local_141;
  string local_140 [36];
  int local_11c;
  ulong local_118;
  ulong local_110;
  char local_101;
  undefined8 local_100;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  string *local_f0;
  string local_e8 [38];
  byte local_c2;
  char local_c1;
  undefined8 local_c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  string *local_b0;
  byte local_a1;
  string local_a0 [32];
  long local_80;
  long local_78;
  long local_70;
  allocator local_51;
  string local_50 [47];
  byte local_21;
  string *local_20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  ulong local_8;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if ((local_21 & 1) == 0) {
    std::__cxx11::string::operator=(local_50,":");
  }
  else {
    std::__cxx11::string::operator=(local_50," ");
  }
  std::__cxx11::string::operator+=(local_50,local_20);
  p_Var1 = local_18;
  uVar2 = std::__cxx11::string::c_str();
  local_70 = std::__cxx11::string::find((char *)p_Var1,uVar2);
  local_78 = std::__cxx11::string::find((char *)local_18,0x1e54ca);
  local_80 = std::__cxx11::string::find((char *)local_18,0x1d797d);
  while( true ) {
    p_Var1 = local_18;
    bVar4 = false;
    if ((local_70 != -1) && (bVar4 = false, local_78 != -1)) {
      bVar4 = local_80 != -1;
    }
    if (!bVar4) break;
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_a0,(ulong)p_Var1);
    local_a1 = 1;
    local_b0 = local_a0;
    local_b8._M_current = (char *)std::__cxx11::string::begin();
    local_c0 = std::__cxx11::string::end();
    while (bVar4 = __gnu_cxx::operator!=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68), bVar4
          ) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_b8);
      local_c1 = *pcVar3;
      local_a1 = 0;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_b8);
    }
    local_c2 = 0;
    if ((local_a1 & 1) != 0) {
      local_c2 = 1;
      std::__cxx11::string::substr((ulong)local_e8,(ulong)local_18);
      std::__cxx11::string::operator=(local_a0,local_e8);
      std::__cxx11::string::~string(local_e8);
      local_f0 = local_a0;
      local_f8._M_current = (char *)std::__cxx11::string::begin();
      local_100 = std::__cxx11::string::end();
      while (bVar4 = __gnu_cxx::operator!=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68),
            bVar4) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_f8);
        local_101 = *pcVar3;
        local_c2 = 0;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_f8);
      }
    }
    if ((local_c2 & 1) == 0) {
      local_11c = 0;
    }
    else {
      local_110 = std::__cxx11::string::find((char *)local_18,0x1e54be);
      local_118 = std::__cxx11::string::find((char *)local_18,0x1d7c9a);
      if (local_118 < local_110) {
        local_11c = 1;
        local_8 = local_118;
      }
      else {
        local_8 = 0xffffffffffffffff;
        local_11c = 1;
      }
    }
    std::__cxx11::string::~string(local_a0);
    if (local_11c != 0) goto LAB_0013b650;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"",&local_141);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    if ((local_21 & 1) == 0) {
      std::__cxx11::string::operator=(local_140,":");
    }
    else {
      std::__cxx11::string::operator=(local_140," ");
    }
    std::__cxx11::string::operator+=(local_140,local_20);
    in_stack_fffffffffffffe70 = local_18;
    uVar2 = std::__cxx11::string::c_str();
    local_70 = std::__cxx11::string::find((char *)in_stack_fffffffffffffe70,uVar2);
    local_78 = std::__cxx11::string::find((char *)local_18,0x1e54ca);
    local_80 = std::__cxx11::string::find((char *)local_18,0x1d797d);
    std::__cxx11::string::~string(local_140);
  }
  local_8 = 0xffffffffffffffff;
  local_11c = 1;
LAB_0013b650:
  std::__cxx11::string::~string(local_50);
  return local_8;
}

Assistant:

size_t Parser::FindConstructor(const std::string & buffer, const std::string & className,
                               bool headerfile, size_t startPos) const
{
  std::string constructor = "";

  if(headerfile)
    {
    constructor = " ";
    }
  else
    {
    constructor = ":";
    }
  constructor += className;
  size_t pos = buffer.find(constructor.c_str(),startPos);
  size_t pos2 = buffer.find("(",pos);
  size_t pos3 = buffer.find(")",pos2);

  // if it's not the destructor ...
  /*std::string dest = "~";
  dest += className;
  long destructor = buffer.find(dest.c_str(),0);*/
  while(pos != std::string::npos && pos2 != std::string::npos && pos3 != std::string::npos)
    {
    //if(pos != destructor+1) // we have the constructor
      {
      // we look if we have only spaces or \n between pos pos2 and pos3
      std::string val = buffer.substr(pos+className.size()+1,pos2-pos-className.size()-1);
      bool ok = true;
      for (char i : val) {
        if (i != ' ' || i != '\n') {
          ok =false;
        }
      }

      bool ok2 = false;
      if(ok)
        {
        ok2 = true;
        val = buffer.substr(pos2+1,pos3-pos2-1);
        for (char i : val) {
          if (i != ' ' || i != '\n') {
            ok2 =false;
          }
        }
        }

      // if ok2 then we check if the constructor is implemented
      if(ok2)
        {
        size_t pos4 = buffer.find(";",pos3);
        size_t pos5 = buffer.find("{",pos3);

        if(pos5<pos4)
          {
          return pos5;
          }
	return std::string::npos;
        }
      }
    std::string localconstructor = "";
    if(headerfile)
      {
      localconstructor = " ";
      }
    else
      {
      localconstructor = ":";
      }
    localconstructor += className;
    pos = buffer.find(localconstructor.c_str(),pos+1);
    pos2 = buffer.find("(",pos);
    pos3 = buffer.find(")",pos2);
    }

  return std::string::npos;
}